

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

void (anonymous_namespace)::roundtrip_into<boost::optional<int>,boost::optional<int>>
               (optional<int> *in,optional<int> *out)

{
  Result *in_R9;
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  InputStream istream;
  Result local_1c8;
  OutputStream ostream;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::detail::BuiltinSerializer<boost::optional<int>,_void>::serialize<OutputStream>
            (in,&ostream);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  istream.stream = (stringstream *)std::ostream::tellp();
  local_1e0 = (ulong)(in->super_type).m_initialized * 4 + 1;
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (&local_1c8,(Expression_lhs<unsigned_long> *)&istream,&local_1e0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x36,0x18c3cc,&local_1c8.m_passed,in_R9);
  doctest::String::~String(&local_1c8.m_decomp);
  istream.stream = &stream;
  mserialize::detail::BuiltinDeserializer<boost::optional<int>,_void>::deserialize<InputStream>
            (out,&istream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void roundtrip_into(const In& in, Out& out)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // make sure computed serialized size is correct
  CHECK(std::size_t(stream.tellp()) == mserialize::serialized_size(in));

  // deserialize
  InputStream istream{stream};
  mserialize::deserialize(out, istream);
}